

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O1

void __thiscall tf::TaskQueue<tf::Node_*>::TaskQueue(TaskQueue<tf::Node_*> *this,int64_t c)

{
  Array *this_00;
  
  (this->_top).super___atomic_base<long>._M_i = 0;
  (this->_bottom).super___atomic_base<long>._M_i = 0;
  (this->_array)._M_b._M_p = (__pointer_type)0x0;
  (this->_garbage).
  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_garbage).
  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_garbage).
  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (c - 1U < (c ^ c - 1U)) {
    (this->_top).super___atomic_base<long>._M_i = 0;
    (this->_bottom).super___atomic_base<long>._M_i = 0;
    this_00 = (Array *)operator_new(0x18);
    Array::Array(this_00,c);
    (this->_array)._M_b._M_p = this_00;
    std::
    vector<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
    ::reserve(&this->_garbage,0x20);
    return;
  }
  __assert_fail("c && (!(c & (c-1)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/tsq.hpp"
                ,0x8c,"tf::TaskQueue<tf::Node *>::TaskQueue(int64_t) [T = tf::Node *]");
}

Assistant:

TaskQueue<T>::TaskQueue(int64_t c) {
  assert(c && (!(c & (c-1))));
  _top.store(0, std::memory_order_relaxed);
  _bottom.store(0, std::memory_order_relaxed);
  _array.store(new Array{c}, std::memory_order_relaxed);
  _garbage.reserve(32);
}